

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<signed_char,unsigned_long_long,3>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *t,uint64_t *u,char *result)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char *in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  
  if (*in_RSI != 0) {
    if (*in_RDI == '\0') {
      *in_RDX = '\0';
    }
    else {
      uVar1 = *in_RSI;
      cVar2 = std::numeric_limits<signed_char>::max();
      if ((ulong)(long)cVar2 < uVar1) {
        cVar2 = *in_RDI;
        cVar3 = std::numeric_limits<signed_char>::min();
        if ((cVar2 == cVar3) &&
           (uVar1 = *in_RSI, cVar2 = std::numeric_limits<signed_char>::min(), uVar1 == (long)cVar2))
        {
          *in_RDX = -1;
        }
        else {
          *in_RDX = '\0';
        }
      }
      else {
        cVar2 = div_signed_uint64<signed_char,_unsigned_long_long,_true>::divide(*in_RDI,*in_RSI);
        *in_RDX = cVar2;
      }
    }
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const std::uint64_t& u, T& result ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");

        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u <= (std::uint64_t)std::numeric_limits<T>::max() )
        {
            result = div_signed_uint64 < T, U, sizeof(T) < sizeof(std::int64_t) > ::divide(t, u);
        }
        else // Corner case
        if( t == std::numeric_limits<T>::min() && u == (std::uint64_t)std::numeric_limits<T>::min() )
        {
            // Min int divided by it's own magnitude is -1
            result = -1;
        }
        else
        {
            result = 0;
        }
    }